

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

void __thiscall CExtKey::SetSeed(CExtKey *this,Span<const_std::byte> seed)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vout;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_1d8;
  CHMAC_SHA512 local_1b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_start =
       secure_allocator<unsigned_char>::allocate((secure_allocator<unsigned_char> *)&local_1d8,0x40)
  ;
  local_1d8._M_impl.super__Vector_impl_data._M_finish =
       local_1d8._M_impl.super__Vector_impl_data._M_start + 0x40;
  local_1d8._M_impl.super__Vector_impl_data._M_start[0] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[1] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[2] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[3] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[4] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[5] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[6] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[7] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[8] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[9] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[10] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0xb] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0xc] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0xd] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0xe] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0xf] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x10] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x11] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x12] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x13] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x14] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x15] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x16] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x17] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x18] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x19] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x1a] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x1b] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x1c] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x1d] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x1e] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x1f] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x20] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x21] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x22] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x23] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x24] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x25] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x26] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x27] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x28] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x29] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x2a] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x2b] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x2c] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x2d] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x2e] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x2f] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x30] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x31] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x32] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x33] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x34] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x35] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x36] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x37] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x38] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x39] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x3a] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x3b] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x3c] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x3d] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x3e] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_start[0x3f] = '\0';
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1d8._M_impl.super__Vector_impl_data._M_finish;
  CHMAC_SHA512::CHMAC_SHA512(&local_1b8,"Bitcoin seed",0xc);
  CSHA512::Write(&local_1b8.inner,seed.m_data,seed.m_size);
  CHMAC_SHA512::Finalize(&local_1b8,local_1d8._M_impl.super__Vector_impl_data._M_start);
  CKey::Set<unsigned_char*>
            (&this->key,local_1d8._M_impl.super__Vector_impl_data._M_start,
             local_1d8._M_impl.super__Vector_impl_data._M_start + 0x20,true);
  uVar1 = *(undefined8 *)(local_1d8._M_impl.super__Vector_impl_data._M_start + 0x20);
  uVar2 = *(undefined8 *)(local_1d8._M_impl.super__Vector_impl_data._M_start + 0x28);
  uVar3 = *(undefined8 *)(local_1d8._M_impl.super__Vector_impl_data._M_start + 0x38);
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)(local_1d8._M_impl.super__Vector_impl_data._M_start + 0x30);
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar3;
  *(undefined8 *)(this->chaincode).super_base_blob<256U>.m_data._M_elems = uVar1;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 8) = uVar2;
  this->nDepth = '\0';
  this->nChild = 0;
  this->vchFingerprint[0] = '\0';
  this->vchFingerprint[1] = '\0';
  this->vchFingerprint[2] = '\0';
  this->vchFingerprint[3] = '\0';
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtKey::SetSeed(Span<const std::byte> seed)
{
    static const unsigned char hashkey[] = {'B','i','t','c','o','i','n',' ','s','e','e','d'};
    std::vector<unsigned char, secure_allocator<unsigned char>> vout(64);
    CHMAC_SHA512{hashkey, sizeof(hashkey)}.Write(UCharCast(seed.data()), seed.size()).Finalize(vout.data());
    key.Set(vout.data(), vout.data() + 32, true);
    memcpy(chaincode.begin(), vout.data() + 32, 32);
    nDepth = 0;
    nChild = 0;
    memset(vchFingerprint, 0, sizeof(vchFingerprint));
}